

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

void xmlFreeDtd(xmlDtdPtr cur)

{
  _xmlNode *p_Var1;
  xmlNodePtr cur_00;
  int iVar2;
  xmlDeregisterNodeFunc *pp_Var3;
  xmlChar *pxVar4;
  _xmlDict *dict;
  
  if (cur == (xmlDtdPtr)0x0) {
    return;
  }
  if (cur->doc == (_xmlDoc *)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = cur->doc->dict;
  }
  if ((xmlRegisterCallbacks != 0) &&
     (pp_Var3 = __xmlDeregisterNodeDefaultValue(), *pp_Var3 != (xmlDeregisterNodeFunc)0x0)) {
    pp_Var3 = __xmlDeregisterNodeDefaultValue();
    (**pp_Var3)((xmlNodePtr)cur);
  }
  p_Var1 = cur->children;
  while (cur_00 = p_Var1, cur_00 != (xmlNodePtr)0x0) {
    p_Var1 = cur_00->next;
    if (2 < cur_00->type - XML_ELEMENT_DECL) {
      xmlUnlinkNodeInternal(cur_00);
      xmlFreeNode(cur_00);
    }
  }
  pxVar4 = cur->name;
  if (pxVar4 != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar2 = xmlDictOwns(dict,pxVar4);
      if (iVar2 != 0) goto LAB_00148f32;
      pxVar4 = cur->name;
    }
    (*xmlFree)(pxVar4);
  }
LAB_00148f32:
  pxVar4 = cur->SystemID;
  if (pxVar4 != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar2 = xmlDictOwns(dict,pxVar4);
      if (iVar2 != 0) goto LAB_00148f5c;
      pxVar4 = cur->SystemID;
    }
    (*xmlFree)(pxVar4);
  }
LAB_00148f5c:
  pxVar4 = cur->ExternalID;
  if (pxVar4 != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar2 = xmlDictOwns(dict,pxVar4);
      if (iVar2 != 0) goto LAB_00148f86;
      pxVar4 = cur->ExternalID;
    }
    (*xmlFree)(pxVar4);
  }
LAB_00148f86:
  if ((xmlNotationTablePtr)cur->notations != (xmlNotationTablePtr)0x0) {
    xmlFreeNotationTable((xmlNotationTablePtr)cur->notations);
  }
  if ((xmlElementTablePtr)cur->elements != (xmlElementTablePtr)0x0) {
    xmlFreeElementTable((xmlElementTablePtr)cur->elements);
  }
  if ((xmlAttributeTablePtr)cur->attributes != (xmlAttributeTablePtr)0x0) {
    xmlFreeAttributeTable((xmlAttributeTablePtr)cur->attributes);
  }
  if ((xmlEntitiesTablePtr)cur->entities != (xmlEntitiesTablePtr)0x0) {
    xmlFreeEntitiesTable((xmlEntitiesTablePtr)cur->entities);
  }
  if ((xmlEntitiesTablePtr)cur->pentities != (xmlEntitiesTablePtr)0x0) {
    xmlFreeEntitiesTable((xmlEntitiesTablePtr)cur->pentities);
  }
  (*xmlFree)(cur);
  return;
}

Assistant:

void
xmlFreeDtd(xmlDtdPtr cur) {
    xmlDictPtr dict = NULL;

    if (cur == NULL) {
	return;
    }
    if (cur->doc != NULL) dict = cur->doc->dict;

    if ((xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue((xmlNodePtr)cur);

    if (cur->children != NULL) {
	xmlNodePtr next, c = cur->children;

	/*
	 * Cleanup all nodes which are not part of the specific lists
	 * of notations, elements, attributes and entities.
	 */
        while (c != NULL) {
	    next = c->next;
	    if ((c->type != XML_ELEMENT_DECL) &&
		(c->type != XML_ATTRIBUTE_DECL) &&
		(c->type != XML_ENTITY_DECL)) {
		xmlUnlinkNodeInternal(c);
		xmlFreeNode(c);
	    }
	    c = next;
	}
    }
    DICT_FREE(cur->name)
    DICT_FREE(cur->SystemID)
    DICT_FREE(cur->ExternalID)
    /* TODO !!! */
    if (cur->notations != NULL)
        xmlFreeNotationTable((xmlNotationTablePtr) cur->notations);

    if (cur->elements != NULL)
        xmlFreeElementTable((xmlElementTablePtr) cur->elements);
    if (cur->attributes != NULL)
        xmlFreeAttributeTable((xmlAttributeTablePtr) cur->attributes);
    if (cur->entities != NULL)
        xmlFreeEntitiesTable((xmlEntitiesTablePtr) cur->entities);
    if (cur->pentities != NULL)
        xmlFreeEntitiesTable((xmlEntitiesTablePtr) cur->pentities);

    xmlFree(cur);
}